

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O3

_Bool bitset_next_set_bit(bitset_t *bitset,size_t *i)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = *i;
  uVar3 = uVar1 >> 6;
  if (bitset->arraysize <= uVar3) {
    return false;
  }
  uVar6 = bitset->array[uVar3] >> ((byte)uVar1 & 0x3f);
  if (uVar6 == 0) {
    lVar4 = uVar3 * -0x40;
    do {
      uVar3 = uVar3 + 1;
      if (bitset->arraysize == uVar3) {
        return false;
      }
      uVar1 = bitset->array[uVar3];
      lVar4 = lVar4 + -0x40;
    } while (uVar1 == 0);
    lVar2 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    sVar5 = lVar2 - lVar4;
  }
  else {
    lVar4 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    sVar5 = lVar4 + uVar1;
  }
  *i = sVar5;
  return true;
}

Assistant:

inline bool bitset_next_set_bit(const bitset_t *bitset, size_t *i) {
    size_t x = *i / 64;
    if (x >= bitset->arraysize) {
        return false;
    }
    uint64_t w = bitset->array[x];
    w >>= (*i & 63);
    if (w != 0) {
        *i += roaring_trailing_zeroes(w);
        return true;
    }
    x++;
    while (x < bitset->arraysize) {
        w = bitset->array[x];
        if (w != 0) {
            *i = x * 64 + roaring_trailing_zeroes(w);
            return true;
        }
        x++;
    }
    return false;
}